

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O1

MeasureUnit *
icu_63::MeasureUnit::resolveUnitPerUnit
          (MeasureUnit *__return_storage_ptr__,MeasureUnit *unit,MeasureUnit *perUnit,
          bool *isResolved)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  char cVar5;
  int32_t iVar6;
  int32_t iVar7;
  undefined **ppuVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  iVar4 = unit->fSubTypeId + (&gOffsets)[unit->fTypeId];
  iVar2 = perUnit->fSubTypeId + (&gOffsets)[perUnit->fTypeId];
  ppuVar8 = (__return_storage_ptr__->super_UObject)._vptr_UObject;
  iVar7 = __return_storage_ptr__->fTypeId;
  iVar6 = __return_storage_ptr__->fSubTypeId;
  cVar5 = __return_storage_ptr__->fCurrency[0];
  iVar10 = 0;
  iVar11 = 8;
  do {
    if (iVar11 <= iVar10) {
      __return_storage_ptr__->fTypeId = iVar7;
      __return_storage_ptr__->fSubTypeId = iVar6;
      __return_storage_ptr__->fCurrency[0] = cVar5;
      (__return_storage_ptr__->super_UObject)._vptr_UObject = (_func_int **)ppuVar8;
      *isResolved = false;
      (__return_storage_ptr__->super_UObject)._vptr_UObject =
           (_func_int **)&PTR__MeasureUnit_003d8e60;
      __return_storage_ptr__->fCurrency[0] = '\0';
      __return_storage_ptr__->fTypeId = 0xe;
      __return_storage_ptr__->fSubTypeId = 0;
      return __return_storage_ptr__;
    }
    iVar9 = (iVar10 + iVar11) / 2;
    lVar3 = (long)iVar9 * 0x10;
    bVar1 = true;
    if (*(int *)(unitPerUnitToSingleUnit + lVar3) <= iVar4) {
      if (*(int *)(unitPerUnitToSingleUnit + lVar3) < iVar4) {
LAB_00255172:
        iVar10 = iVar9 + 1;
        iVar9 = iVar11;
      }
      else if (*(int *)(unitPerUnitToSingleUnit + lVar3 + 4) <= iVar2) {
        if (*(int *)(unitPerUnitToSingleUnit + lVar3 + 4) < iVar2) goto LAB_00255172;
        *isResolved = true;
        iVar7 = *(int32_t *)(unitPerUnitToSingleUnit + lVar3 + 8);
        iVar6 = *(int32_t *)(unitPerUnitToSingleUnit + lVar3 + 0xc);
        cVar5 = '\0';
        ppuVar8 = &PTR__MeasureUnit_003d8e60;
        bVar1 = false;
        iVar9 = iVar11;
      }
    }
    iVar11 = iVar9;
    if (!bVar1) {
      __return_storage_ptr__->fTypeId = iVar7;
      __return_storage_ptr__->fSubTypeId = iVar6;
      __return_storage_ptr__->fCurrency[0] = cVar5;
      (__return_storage_ptr__->super_UObject)._vptr_UObject = (_func_int **)ppuVar8;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

MeasureUnit MeasureUnit::resolveUnitPerUnit(
        const MeasureUnit &unit, const MeasureUnit &perUnit, bool* isResolved) {
    int32_t unitOffset = unit.getOffset();
    int32_t perUnitOffset = perUnit.getOffset();

    // binary search for (unitOffset, perUnitOffset)
    int32_t start = 0;
    int32_t end = UPRV_LENGTHOF(unitPerUnitToSingleUnit);
    while (start < end) {
        int32_t mid = (start + end) / 2;
        int32_t *midRow = unitPerUnitToSingleUnit[mid];
        if (unitOffset < midRow[0]) {
            end = mid;
        } else if (unitOffset > midRow[0]) {
            start = mid + 1;
        } else if (perUnitOffset < midRow[1]) {
            end = mid;
        } else if (perUnitOffset > midRow[1]) {
            start = mid + 1;
        } else {
            // We found a resolution for our unit / per-unit combo
            // return it.
            *isResolved = true;
            return MeasureUnit(midRow[2], midRow[3]);
        }
    }

    *isResolved = false;
    return MeasureUnit();
}